

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cc
# Opt level: O3

ostream * cnn::operator<<(ostream *os,Dim *d)

{
  ostream *poVar1;
  ulong uVar2;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_23,1);
  if (d->nd != 0) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_24,1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      uVar2 = uVar2 + 1;
    } while (uVar2 < d->nd);
  }
  if (d->bd != 1) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_22,1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  return poVar1;
}

Assistant:

ostream& operator<<(ostream& os, const Dim& d) {
  os << '{';
  for (unsigned i = 0; i < d.nd; ++i) {
    if (i) os << ',';
    os << d.d[i];
  }
  if(d.bd != 1) os << 'X' << d.bd;
  return os << '}';
}